

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O2

wstring * __thiscall
lzstring::LZString::DeCompressFromUint8Array_abi_cxx11_
          (wstring *__return_storage_ptr__,LZString *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *input)

{
  pointer puVar1;
  pointer puVar2;
  size_t i;
  ulong uVar3;
  wstring res;
  wstring local_40;
  
  puVar1 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = L'\0';
    for (uVar3 = 0; uVar3 < (ulong)((long)puVar2 - (long)puVar1) >> 1; uVar3 = uVar3 + 1) {
      this = (LZString *)
             (ulong)(ushort)(*(ushort *)(puVar1 + uVar3 * 2) << 8 |
                            *(ushort *)(puVar1 + uVar3 * 2) >> 8);
      std::__cxx11::wstring::push_back((wchar_t)&local_40);
      puVar1 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    DeCompress(__return_storage_ptr__,this,&local_40);
    std::__cxx11::wstring::~wstring((wstring *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring LZString::DeCompressFromUint8Array(const std::vector<uint8_t> &input)
{
	if (input.empty())
		return std::wstring();

	std::wstring res;
	for (size_t i = 0; i < input.size() / 2; i++)
	{
		res += (wchar_t)(input[i * 2] * 256 + input[i * 2 + 1]);
	}

	return DeCompress(res);
}